

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

void __thiscall Graph::createList(Graph *this)

{
  uint uVar1;
  long lVar2;
  iterator iVar3;
  int (*paiVar4) [50];
  ulong uVar5;
  long lVar6;
  int *piVar7;
  vector<int,_std::allocator<int>_> *pvVar8;
  int iVar9;
  int j;
  ulong uVar10;
  int iVar11;
  int local_58;
  int local_54;
  Graph *local_50;
  int (*local_48) [50];
  vector<int,_std::allocator<int>_> *local_40;
  ulong local_38;
  
  uVar1 = this->num_of_vert;
  pvVar8 = this->adj_list;
  lVar6 = 0;
  local_50 = this;
  do {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               ((long)&(pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar6),1);
    lVar2 = *(long *)((long)&(pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar6);
    if (*(long *)((long)&this->adj_list[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + lVar6) != lVar2) {
      *(long *)((long)&this->adj_list[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + lVar6) = lVar2;
    }
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x4b0);
  if (0 < (int)uVar1) {
    local_48 = local_50->adj_matrix;
    uVar5 = 0;
    local_40 = pvVar8;
    do {
      paiVar4 = local_48;
      pvVar8 = local_40 + uVar5;
      uVar10 = 0;
      local_38 = uVar5;
      do {
        if (paiVar4[uVar5][uVar10] == 1) {
          local_54 = (int)uVar10 + 1;
          iVar3._M_current =
               (pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar8,iVar3,&local_54);
          }
          else {
            *iVar3._M_current = local_54;
            (pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar3._M_current + 1;
          }
        }
        piVar7 = paiVar4[uVar5] + uVar10;
        if (1 < *piVar7) {
          local_50->multigraph_status = true;
          local_50->adjoint_status = false;
          local_50->line_status = false;
          if (0 < *piVar7) {
            iVar9 = (int)uVar10 + 1;
            iVar11 = 0;
            do {
              iVar3._M_current =
                   (pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              local_58 = iVar9;
              if (iVar3._M_current ==
                  (pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (pvVar8,iVar3,&local_58);
              }
              else {
                *iVar3._M_current = iVar9;
                (pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish = iVar3._M_current + 1;
              }
              iVar11 = iVar11 + 1;
            } while (iVar11 < *piVar7);
          }
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar1);
      uVar5 = local_38 + 1;
    } while (uVar5 != uVar1);
  }
  return;
}

Assistant:

void Graph::createList(){
   int nv = this->num_of_vert;
   this->clearList();
   for(int i = 0; i < nv; i++)
      for(int j = 0; j < nv; j++){
         if(this->adj_matrix[i][j] == 1){
            // pushes index of current column + 1 (current vertex)
            this->adj_list[i].push_back(j + 1);
         }
         // if value is bigger than 1, then G is a multigraph
         if(this->adj_matrix[i][j] > 1){
            this->multigraph_status = true;
            this->adjoint_status = false;
            this->line_status = false;
            for(int k = 0; k < this->adj_matrix[i][j]; k++){
               this->adj_list[i].push_back(j + 1);
            }
         }
      }
   return void();
}